

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O0

void addDisc(BamAlignment *aln,int *bpRegion,vector<DiscNode,_std::allocator<DiscNode>_> *nodes)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  undefined8 in_stack_ffffffffffffff38;
  undefined2 uVar4;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  undefined1 local_b8 [8];
  DiscNode dn;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  undefined1 local_88 [7];
  bool isSC;
  vector<int,_std::allocator<int>_> genomePositions;
  vector<int,_std::allocator<int>_> readPositions;
  vector<int,_std::allocator<int>_> clipSizes;
  int support;
  int insSz;
  int iStack_30;
  bool downIsRev;
  int downEn;
  int downSt;
  int iStack_24;
  bool upIsRev;
  int upEn;
  int upSt;
  vector<DiscNode,_std::allocator<DiscNode>_> *nodes_local;
  int *bpRegion_local;
  BamAlignment *aln_local;
  
  uVar4 = (undefined2)((ulong)in_stack_ffffffffffffff38 >> 0x30);
  _upEn = (vector<DiscNode,std::allocator<DiscNode>> *)nodes;
  nodes_local = (vector<DiscNode,_std::allocator<DiscNode>_> *)bpRegion;
  bpRegion_local = (int *)aln;
  bVar3 = BamTools::BamAlignment::IsMapped(aln);
  if (((bVar3) &&
      (bVar3 = BamTools::BamAlignment::IsMateMapped((BamAlignment *)bpRegion_local), bVar3)) &&
     (bVar3 = BamTools::BamAlignment::IsProperPair((BamAlignment *)bpRegion_local), !bVar3)) {
    iStack_24 = bpRegion_local[0x2b];
    downSt = BamTools::BamAlignment::GetEndPosition
                       ((BamAlignment *)
                        CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                        SUB21((ushort)uVar4 >> 8,0),SUB21(uVar4,0));
    downEn._3_1_ = BamTools::BamAlignment::IsReverseStrand((BamAlignment *)bpRegion_local);
    iStack_30 = bpRegion_local[0x35];
    insSz = iStack_30 + bpRegion_local[8];
    support._3_1_ = BamTools::BamAlignment::IsMateReverseStrand((BamAlignment *)bpRegion_local);
    clipSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = bpRegion_local[0x36];
    iVar2 = bpRegion_local[0x2b];
    iVar1 = bpRegion_local[0x35];
    if (iVar1 < iVar2) {
      std::swap<int>(&stack0xffffffffffffffdc,&stack0xffffffffffffffd0);
      std::swap<int>(&downSt,&insSz);
      std::swap<bool>((bool *)((long)&downEn + 3),(bool *)((long)&support + 3));
      clipSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           -clipSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_;
    }
    clipSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._1_3_ = 0;
    clipSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_1_ = iVar1 >= iVar2;
    if (((clipSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ < 50000) && ((downEn._3_1_ & 1) == 0)) &&
       ((support._3_1_ & 1) != 0)) {
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)
                 &readPositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)
                 &genomePositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_88);
      bVar3 = BamTools::BamAlignment::GetSoftClips
                        ((BamAlignment *)
                         CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                         in_stack_ffffffffffffff68,
                         (vector<int,_std::allocator<int>_> *)CONCAT44(dn.refID,dn.support),
                         (vector<int,_std::allocator<int>_> *)dn._8_8_,(bool)dn.upEnd._3_1_);
      if (!bVar3) {
        DiscNode::DiscNode((DiscNode *)local_b8,iStack_24,downSt,iStack_30,insSz,
                           bpRegion_local[0x2a],
                           (uint)clipSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
        std::vector<DiscNode,std::allocator<DiscNode>>::emplace_back<DiscNode&>
                  (_upEn,(DiscNode *)local_b8);
      }
      dn.support = (int)bVar3;
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_88)
      ;
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 &genomePositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 &readPositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
  }
  return;
}

Assistant:

void addDisc(BamTools::BamAlignment &aln, const int &bpRegion, std::vector<DiscNode> &nodes)
{
	// both reads should be mapped
	if (!aln.IsMapped() || !aln.IsMateMapped())
		return;
	if (aln.IsProperPair())
		return;

	int upSt = aln.Position;
	int upEn = aln.GetEndPosition();
	bool upIsRev = aln.IsReverseStrand();
	int downSt = aln.MatePosition;
	int downEn = downSt + aln.Length;
	bool downIsRev = aln.IsMateReverseStrand();
	int insSz = aln.InsertSize;
	int support = 1;

	// current read is 3` and its mate at 5`
	if (aln.Position > aln.MatePosition)
	{
		std::swap(upSt, downSt);
		std::swap(upEn, downEn);
		std::swap(upIsRev, downIsRev);
		insSz *= -1;
		// do not add the same read twice
		support = 0;
	}

	if (insSz >= MAX_LARGE_DEL_LEN)
		return;

	// up should be forward and down should be reverse
	if (upIsRev || !downIsRev)
		return;

	std::vector<int> clipSizes, readPositions, genomePositions;
	bool isSC = aln.GetSoftClips(clipSizes, readPositions, genomePositions);
	// read should not have SC
	if (isSC)
		return;

	DiscNode dn(upSt, upEn, downSt, downEn, aln.RefID, support);
	nodes.emplace_back(dn);
}